

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

MOJOSHADER_error * errorlist_flatten(ErrorList *list)

{
  ErrorItem *pEVar1;
  undefined4 uVar2;
  MOJOSHADER_error *pMVar3;
  ErrorItem *next;
  ErrorItem *item;
  MOJOSHADER_error *retval;
  int total;
  ErrorList *list_local;
  
  if (list->count == 0) {
    list_local = (ErrorList *)0x0;
  }
  else {
    retval._4_4_ = 0;
    list_local = (ErrorList *)(*list->m)(list->count * 0x18,list->d);
    if (list_local == (ErrorList *)0x0) {
      list_local = (ErrorList *)0x0;
    }
    else {
      next = (list->head).next;
      while (next != (ErrorItem *)0x0) {
        pEVar1 = next->next;
        pMVar3 = &(list_local->head).error + retval._4_4_;
        pMVar3->error = (next->error).error;
        pMVar3->filename = (next->error).filename;
        uVar2 = *(undefined4 *)&(next->error).field_0x14;
        pMVar3->error_position = (next->error).error_position;
        *(undefined4 *)&pMVar3->field_0x14 = uVar2;
        (*list->f)(next,list->d);
        retval._4_4_ = retval._4_4_ + 1;
        next = pEVar1;
      }
      if (retval._4_4_ != list->count) {
        __assert_fail("total == list->count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                      ,0x281,"MOJOSHADER_error *errorlist_flatten(ErrorList *)");
      }
      list->count = 0;
      (list->head).next = (ErrorItem *)0x0;
      list->tail = &list->head;
    }
  }
  return (MOJOSHADER_error *)list_local;
}

Assistant:

MOJOSHADER_error *errorlist_flatten(ErrorList *list)
{
    if (list->count == 0)
        return NULL;

    int total = 0;
    MOJOSHADER_error *retval = (MOJOSHADER_error *)
            list->m(sizeof (MOJOSHADER_error) * list->count, list->d);
    if (retval == NULL)
        return NULL;

    ErrorItem *item = list->head.next;
    while (item != NULL)
    {
        ErrorItem *next = item->next;
        // reuse the string allocations
        memcpy(&retval[total], &item->error, sizeof (MOJOSHADER_error));
        list->f(item, list->d);
        item = next;
        total++;
    } // while

    assert(total == list->count);
    list->count = 0;
    list->head.next = NULL;
    list->tail = &list->head;
    return retval;
}